

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O1

int http_get(HTTP_INFO *hi,char *url,char *response,int size)

{
  BOOL verify;
  int iVar1;
  uint uVar2;
  uint len;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *__s;
  int https;
  char port [10];
  int opt;
  socklen_t slen;
  char err [100];
  char host [256];
  char dir [1024];
  char request [1024];
  uint local_9cc;
  char *local_9c8;
  char local_9ba [10];
  int local_9b0 [2];
  char local_9a8 [112];
  char local_938 [256];
  char local_838 [1024];
  char local_438 [1032];
  
  if (hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  verify = (hi->tls).verify;
  local_9c8 = response;
  parse_url(url,(int *)&local_9cc,local_938,local_9ba,local_838);
  uVar2 = local_9cc;
  iVar3 = (hi->tls).ssl_fd.fd;
  if ((((iVar3 == -1) || (local_9cc != (hi->url).https)) ||
      (iVar1 = strcmp((hi->url).host,local_938), iVar1 != 0)) ||
     (iVar1 = strcmp((hi->url).port,local_9ba), iVar1 != 0)) {
    https_close(hi);
LAB_0011093a:
    https_init(hi,(BOOL)local_9cc,verify);
    uVar2 = https_connect(hi,local_938,local_9ba);
    if ((int)uVar2 < 0) goto LAB_00110a57;
  }
  else {
    local_9b0[1] = 4;
    iVar3 = getsockopt(iVar3,1,4,local_9b0,(socklen_t *)(local_9b0 + 1));
    if ((iVar3 < 0) || (0 < local_9b0[0])) {
      https_close(hi);
      local_9cc._0_1_ = (BOOL)uVar2;
      goto LAB_0011093a;
    }
  }
  len = snprintf(local_438,0x400,
                 "GET %s HTTP/1.1\r\nUser-Agent: Mozilla/4.0\r\nHost: %s:%s\r\nContent-Type: application/json; charset=utf-8\r\nConnection: Keep-Alive\r\n%s\r\n"
                 ,local_838,local_938,local_9ba,(hi->request).cookie);
  uVar2 = https_write(hi,local_438,len);
  __s = local_9c8;
  if (uVar2 == len) {
    (hi->response).status = 0;
    (hi->response).content_length = 0;
    (hi->response).close = '\0';
    hi->r_len = 0;
    hi->header_end = '\0';
    hi->body = local_9c8;
    hi->body_size = (long)size;
    hi->body_len = 0;
    while( true ) {
      do {
        uVar2 = https_read(hi,hi->r_buf + hi->r_len,0x800 - (int)hi->r_len);
      } while (uVar2 == 0xffff9700);
      if ((int)uVar2 < 0) {
        https_close(hi);
        mbedtls_strerror(uVar2,local_9a8,100);
        goto LAB_00110a8e;
      }
      if (uVar2 == 0) break;
      lVar4 = (ulong)uVar2 + hi->r_len;
      hi->r_len = lVar4;
      hi->r_buf[lVar4] = '\0';
      iVar3 = http_parse(hi);
      if (iVar3 != 0) {
LAB_00110ad5:
        if ((hi->response).close == '\x01') {
          https_close(hi);
        }
        else {
          sVar5 = strlen(local_938);
          strncpy((hi->url).host,local_938,sVar5);
          sVar5 = strlen(local_9ba);
          strncpy((hi->url).port,local_9ba,sVar5);
          sVar5 = strlen(local_838);
          strncpy((hi->url).path,local_838,sVar5);
        }
        return (hi->response).status;
      }
    }
    https_close(hi);
    goto LAB_00110ad5;
  }
LAB_00110a57:
  https_close(hi);
  mbedtls_strerror(uVar2,local_9a8,100);
  __s = local_9c8;
LAB_00110a8e:
  snprintf(__s,0x100,"socket error: %s(%d)",local_9a8,(ulong)uVar2);
  return -1;
}

Assistant:

int http_get(HTTP_INFO *hi, char *url, char *response, int size)
{
    char        request[1024], err[100];
    char        host[256], port[10], dir[1024];
    int         sock_fd, https, verify;
    int         ret, opt, len;
    socklen_t   slen;


    if(NULL == hi) return -1;

    verify = hi->tls.verify;

    parse_url(url, &https, host, port, dir);

    if( (hi->tls.ssl_fd.fd == -1) || (hi->url.https != https) ||
        (strcmp(hi->url.host, host) != 0) || (strcmp(hi->url.port, port) != 0) )
    {
        https_close(hi);

        https_init(hi, https, verify);

        if((ret=https_connect(hi, host, port)) < 0)
        {
            https_close(hi);

            mbedtls_strerror(ret, err, 100);
            snprintf(response, 256, "socket error: %s(%d)", err, ret);
            return -1;
        }
    }
    else
    {
        sock_fd = hi->tls.ssl_fd.fd;

        slen = sizeof(int);

        if((getsockopt(sock_fd, SOL_SOCKET, SO_ERROR, (void *)&opt, &slen) < 0) || (opt > 0))
        {
            https_close(hi);

            https_init(hi, https, verify);

            if((ret=https_connect(hi, host, port)) < 0)
            {
                https_close(hi);

                mbedtls_strerror(ret, err, 100);
                snprintf(response, 256, "socket error: %s(%d)", err, ret);
                return -1;
            }
        }
    }

    /* Send HTTP request. */
    len = snprintf(request, 1024,
            "GET %s HTTP/1.1\r\n"
            "User-Agent: Mozilla/4.0\r\n"
            "Host: %s:%s\r\n"
            "Content-Type: application/json; charset=utf-8\r\n"
            "Connection: Keep-Alive\r\n"
            "%s\r\n",
            dir, host, port, hi->request.cookie);

    if((ret = https_write(hi, request, len)) != len)
    {
        https_close(hi);

        mbedtls_strerror(ret, err, 100);

        snprintf(response, 256, "socket error: %s(%d)", err, ret);

        return -1;
    }

//  printf("request: %s \r\n\r\n", request);

    hi->response.status = 0;
    hi->response.content_length = 0;
    hi->response.close = 0;

    hi->r_len = 0;
    hi->header_end = 0;

    hi->body = response;
    hi->body_size = size;
    hi->body_len = 0;

    while(1)
    {
        ret = https_read(hi, &hi->r_buf[hi->r_len], (int)(H_READ_SIZE - hi->r_len));
        if(ret == MBEDTLS_ERR_SSL_WANT_READ) continue;
        else if(ret < 0)
        {
            https_close(hi);

            mbedtls_strerror(ret, err, 100);

            snprintf(response, 256, "socket error: %s(%d)", err, ret);

            return -1;
        }
        else if(ret == 0)
        {
            https_close(hi);
            break;
        }

        hi->r_len += ret;
        hi->r_buf[hi->r_len] = 0;

        // printf("read(%ld): |%s| \n", hi->r_len, hi->r_buf);
        // printf("read(%ld) ... \n", hi->r_len);

        if(http_parse(hi) != 0) break;
    }

    if(hi->response.close == 1)
    {
        https_close(hi);
    }
    else
    {
        strncpy(hi->url.host, host, strlen(host));
        strncpy(hi->url.port, port, strlen(port));
        strncpy(hi->url.path, dir, strlen(dir));
    }

    /*
    printf("status: %d \n", hi->response.status);
    printf("cookie: %s \n", hi->response.cookie);
    printf("location: %s \n", hi->response.location);
    printf("referrer: %s \n", hi->response.referrer);
    printf("length: %ld \n", hi->response.content_length);
    printf("body: %ld \n", hi->body_len);
    */

    return hi->response.status;

}